

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::incoming_request_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,incoming_request_alert *this)

{
  char msg [1024];
  string local_438;
  char local_418 [1024];
  
  peer_alert::message_abi_cxx11_(&local_438,&this->super_peer_alert);
  snprintf(local_418,0x400,"%s: incoming request [ piece: %d start: %d length: %d ]",
           local_438._M_dataplus._M_p,(ulong)*(uint *)&(this->super_peer_alert).field_0x9c,
           (ulong)*(uint *)&this->field_0xa0,*(undefined4 *)&this->field_0xa4);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_418,(allocator<char> *)&local_438);
  return __return_storage_ptr__;
}

Assistant:

std::string incoming_request_alert::message() const
	{
		char msg[1024];
		std::snprintf(msg, sizeof(msg), "%s: incoming request [ piece: %d start: %d length: %d ]"
			, peer_alert::message().c_str(), static_cast<int>(req.piece)
			, req.start, req.length);
		return msg;
	}